

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O2

Regexp * re2::SimplifyWalker::Concat2(Regexp *re1,Regexp *re2,ParseFlags parse_flags)

{
  Regexp *this;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar1;
  
  this = (Regexp *)operator_new(0x28);
  Regexp::Regexp(this,kRegexpConcat,parse_flags);
  Regexp::AllocSub(this,2);
  if (this->nsub_ < 2) {
    paVar1 = &this->field_5;
  }
  else {
    paVar1 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
  }
  paVar1->subone_ = re1;
  paVar1[1].subone_ = re2;
  return this;
}

Assistant:

Regexp* SimplifyWalker::Concat2(Regexp* re1, Regexp* re2,
                                Regexp::ParseFlags parse_flags) {
  Regexp* re = new Regexp(kRegexpConcat, parse_flags);
  re->AllocSub(2);
  Regexp** subs = re->sub();
  subs[0] = re1;
  subs[1] = re2;
  return re;
}